

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

HeapType __thiscall
wasm::anon_unknown_0::RecGroupStore::insert
          (RecGroupStore *this,
          unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
          *info)

{
  RecGroup this_00;
  RecGroup RVar1;
  uintptr_t uVar2;
  HeapType local_28;
  
  std::mutex::lock((mutex *)wasm::(anonymous_namespace)::globalRecGroupStore);
  local_28.id = (this->mutex).super___mutex_base._M_mutex.__align;
  if (*(long *)(local_28.id + 0x20) == 0) {
    this_00 = HeapType::getRecGroup(&local_28);
    RVar1 = insert(this_00.id,(RecGroup)info);
    if (this_00.id == RVar1.id) {
      std::recursive_mutex::lock
                ((recursive_mutex *)wasm::(anonymous_namespace)::globalHeapTypeStoreMutex);
      std::
      vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
      ::
      emplace_back<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>
                ((vector<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>,std::allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>>
                  *)&wasm::(anonymous_namespace)::globalHeapTypeStore,
                 (unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
                  *)this);
      pthread_mutex_unlock((pthread_mutex_t *)wasm::(anonymous_namespace)::globalHeapTypeStoreMutex)
      ;
    }
    if ((RVar1.id & 1) == 0) {
      uVar2 = **(uintptr_t **)RVar1.id;
    }
    else {
      uVar2 = RVar1.id & 0xfffffffffffffffe;
    }
    pthread_mutex_unlock((pthread_mutex_t *)wasm::(anonymous_namespace)::globalRecGroupStore);
    return (HeapType)uVar2;
  }
  __assert_fail("!info->recGroup && \"Unexpected nontrivial rec group\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x24e,
                "HeapType wasm::(anonymous namespace)::RecGroupStore::insert(std::unique_ptr<HeapTypeInfo> &&)"
               );
}

Assistant:

HeapType insert(std::unique_ptr<HeapTypeInfo>&& info) {
    std::lock_guard<std::mutex> lock(mutex);
    assert(!info->recGroup && "Unexpected nontrivial rec group");
    auto group = asHeapType(info).getRecGroup();
    auto canonical = insert(group);
    if (group == canonical) {
      std::lock_guard<std::recursive_mutex> storeLock(globalHeapTypeStoreMutex);
      globalHeapTypeStore.emplace_back(std::move(info));
    }
    return canonical[0];
  }